

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment.cpp
# Opt level: O0

CONTAINER_TYPE license::os::checkSystemdContainer(void)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  long lVar4;
  string local_248 [8];
  string line;
  CONTAINER_TYPE local_214;
  istream aiStack_210 [4];
  CONTAINER_TYPE result;
  ifstream systemd_container;
  
  std::ifstream::ifstream(aiStack_210,"/var/run/systemd/container",_S_in);
  local_214 = NONE;
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    local_214 = DOCKER;
    std::__cxx11::string::string(local_248);
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(aiStack_210,local_248)
      ;
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) goto LAB_00120afe;
      lVar4 = std::__cxx11::string::find((char *)local_248,0x1c1567);
      if (lVar4 != -1) {
        local_214 = DOCKER;
        goto LAB_00120afe;
      }
      lVar4 = std::__cxx11::string::find((char *)local_248,0x1c156e);
    } while (lVar4 == -1);
    local_214 = LXC;
LAB_00120afe:
    std::__cxx11::string::~string(local_248);
  }
  std::ifstream::~ifstream(aiStack_210);
  return local_214;
}

Assistant:

static CONTAINER_TYPE checkSystemdContainer() {
	ifstream systemd_container("/var/run/systemd/container");
	CONTAINER_TYPE result = CONTAINER_TYPE::NONE;
	if (systemd_container.good()) {
		result = CONTAINER_TYPE::DOCKER;
		for (string line; getline(systemd_container, line);) {
			if (line.find("docker") != string::npos) {
				result = CONTAINER_TYPE::DOCKER;
				break;
			} else if (line.find("lxc") != string::npos) {
				result = CONTAINER_TYPE::LXC;
				break;
			}
		}
	}
	return result;
}